

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar5.c
# Opt level: O0

wchar_t process_head_file_extra(archive_read *a,archive_entry *e,rar5 *rar,ssize_t extra_data_size)

{
  wchar_t wVar1;
  size_t local_50;
  size_t var_size;
  size_t sStack_40;
  wchar_t ret;
  size_t extra_field_id;
  size_t extra_field_size;
  ssize_t extra_data_size_local;
  rar5 *rar_local;
  archive_entry *e_local;
  archive_read *a_local;
  
  sStack_40 = 0;
  var_size._4_4_ = L'\xffffffe2';
  extra_field_size = extra_data_size;
  extra_data_size_local = (ssize_t)rar;
  rar_local = (rar5 *)e;
  e_local = (archive_entry *)a;
  while( true ) {
    if ((long)extra_field_size < 1) {
      if (var_size._4_4_ == L'\0') {
        a_local._4_4_ = L'\0';
      }
      else {
        a_local._4_4_ = var_size._4_4_;
      }
      return a_local._4_4_;
    }
    wVar1 = read_var_sized((archive_read *)e_local,&extra_field_id,&local_50);
    if (wVar1 == L'\0') {
      return L'\x01';
    }
    extra_field_size = extra_field_size - local_50;
    wVar1 = consume((archive_read *)e_local,local_50);
    if (wVar1 != L'\0') {
      return L'\x01';
    }
    wVar1 = read_var_sized((archive_read *)e_local,&stack0xffffffffffffffc0,&local_50);
    if (wVar1 == L'\0') break;
    extra_field_size = extra_field_size - local_50;
    wVar1 = consume((archive_read *)e_local,local_50);
    if (wVar1 != L'\0') {
      return L'\x01';
    }
    switch(sStack_40) {
    case 1:
    case 7:
    default:
      wVar1 = consume((archive_read *)e_local,extra_field_size);
      return wVar1;
    case 2:
      var_size._4_4_ =
           parse_file_extra_hash
                     ((archive_read *)e_local,(rar5 *)extra_data_size_local,
                      (ssize_t *)&extra_field_size);
      break;
    case 3:
      var_size._4_4_ =
           parse_file_extra_htime
                     ((archive_read *)e_local,(archive_entry *)rar_local,
                      (rar5 *)extra_data_size_local,(ssize_t *)&extra_field_size);
      break;
    case 4:
      var_size._4_4_ =
           parse_file_extra_version
                     ((archive_read *)e_local,(archive_entry *)rar_local,
                      (ssize_t *)&extra_field_size);
      break;
    case 5:
      var_size._4_4_ =
           parse_file_extra_redir
                     ((archive_read *)e_local,(archive_entry *)rar_local,
                      (rar5 *)extra_data_size_local,(ssize_t *)&extra_field_size);
      break;
    case 6:
      var_size._4_4_ =
           parse_file_extra_owner
                     ((archive_read *)e_local,(archive_entry *)rar_local,
                      (ssize_t *)&extra_field_size);
    }
  }
  return L'\x01';
}

Assistant:

static int process_head_file_extra(struct archive_read* a,
    struct archive_entry* e, struct rar5* rar, ssize_t extra_data_size)
{
	size_t extra_field_size;
	size_t extra_field_id = 0;
	int ret = ARCHIVE_FATAL;
	size_t var_size;

	while(extra_data_size > 0) {
		if(!read_var_sized(a, &extra_field_size, &var_size))
			return ARCHIVE_EOF;

		extra_data_size -= var_size;
		if(ARCHIVE_OK != consume(a, var_size)) {
			return ARCHIVE_EOF;
		}

		if(!read_var_sized(a, &extra_field_id, &var_size))
			return ARCHIVE_EOF;

		extra_data_size -= var_size;
		if(ARCHIVE_OK != consume(a, var_size)) {
			return ARCHIVE_EOF;
		}

		switch(extra_field_id) {
			case EX_HASH:
				ret = parse_file_extra_hash(a, rar,
				    &extra_data_size);
				break;
			case EX_HTIME:
				ret = parse_file_extra_htime(a, e, rar,
				    &extra_data_size);
				break;
			case EX_REDIR:
				ret = parse_file_extra_redir(a, e, rar,
				    &extra_data_size);
				break;
			case EX_UOWNER:
				ret = parse_file_extra_owner(a, e,
				    &extra_data_size);
				break;
			case EX_VERSION:
				ret = parse_file_extra_version(a, e,
				    &extra_data_size);
				break;
			case EX_CRYPT:
				/* fallthrough */
			case EX_SUBDATA:
				/* fallthrough */
			default:
				/* Skip unsupported entry. */
				return consume(a, extra_data_size);
		}
	}

	if(ret != ARCHIVE_OK) {
		/* Attribute not implemented. */
		return ret;
	}

	return ARCHIVE_OK;
}